

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_dense.c
# Opt level: O0

SUNLinearSolver SUNLinSol_Dense(N_Vector y,SUNMatrix A)

{
  int iVar1;
  long lVar2;
  long lVar3;
  sunindextype sVar4;
  _generic_N_Vector_Ops *__ptr;
  long *__ptr_00;
  void *pvVar5;
  sunindextype VecLength;
  sunindextype MatrixRows;
  SUNLinearSolverContent_Dense content;
  SUNLinearSolver_Ops ops;
  SUNLinearSolver S;
  SUNMatrix A_local;
  N_Vector y_local;
  
  iVar1 = SUNMatGetID(A);
  if (iVar1 == 0) {
    lVar2 = SUNDenseMatrix_Rows(A);
    lVar3 = SUNDenseMatrix_Columns(A);
    if (lVar2 == lVar3) {
      lVar2 = SUNDenseMatrix_Rows(A);
      iVar1 = N_VGetVectorID(y);
      if (((iVar1 != 0) && (iVar1 = N_VGetVectorID(y), iVar1 != 2)) &&
         (iVar1 = N_VGetVectorID(y), iVar1 != 3)) {
        return (SUNLinearSolver)0x0;
      }
      sVar4 = GlobalVectorLength_DenseLS(y);
      if (lVar2 == sVar4) {
        y_local = (N_Vector)malloc(0x10);
        if (y_local == (N_Vector)0x0) {
          y_local = (N_Vector)0x0;
        }
        else {
          __ptr = (_generic_N_Vector_Ops *)malloc(0x68);
          if (__ptr == (_generic_N_Vector_Ops *)0x0) {
            free(y_local);
            y_local = (N_Vector)0x0;
          }
          else {
            __ptr->nvgetvectorid = SUNLinSolGetType_Dense;
            __ptr->nvspace = SUNLinSolInitialize_Dense;
            __ptr->nvgetarraypointer = SUNLinSolSetup_Dense;
            __ptr->nvsetarraypointer = SUNLinSolSolve_Dense;
            __ptr->nvprod = SUNLinSolLastFlag_Dense;
            __ptr->nvdiv = SUNLinSolSpace_Dense;
            __ptr->nvabs = SUNLinSolFree_Dense;
            __ptr->nvclone = (_func_N_Vector_N_Vector *)0x0;
            __ptr->nvcloneempty = (_func_N_Vector_N_Vector *)0x0;
            __ptr->nvdestroy = (_func_void_N_Vector *)0x0;
            __ptr->nvlinearsum = (_func_void_realtype_N_Vector_realtype_N_Vector_N_Vector *)0x0;
            __ptr->nvconst = (_func_void_realtype_N_Vector *)0x0;
            __ptr->nvscale = (_func_void_realtype_N_Vector_N_Vector *)0x0;
            __ptr_00 = (long *)malloc(0x18);
            if (__ptr_00 == (long *)0x0) {
              free(__ptr);
              free(y_local);
              y_local = (N_Vector)0x0;
            }
            else {
              *__ptr_00 = lVar2;
              __ptr_00[2] = 0;
              __ptr_00[1] = 0;
              pvVar5 = malloc(lVar2 << 3);
              __ptr_00[1] = (long)pvVar5;
              if (__ptr_00[1] == 0) {
                free(__ptr_00);
                free(__ptr);
                free(y_local);
                y_local = (N_Vector)0x0;
              }
              else {
                y_local->content = __ptr_00;
                y_local->ops = __ptr;
              }
            }
          }
        }
      }
      else {
        y_local = (N_Vector)0x0;
      }
    }
    else {
      y_local = (N_Vector)0x0;
    }
  }
  else {
    y_local = (N_Vector)0x0;
  }
  return (SUNLinearSolver)y_local;
}

Assistant:

SUNLinearSolver SUNLinSol_Dense(N_Vector y, SUNMatrix A)
{
  SUNLinearSolver S;
  SUNLinearSolver_Ops ops;
  SUNLinearSolverContent_Dense content;
  sunindextype MatrixRows, VecLength;
  
  /* Check compatibility with supplied SUNMatrix and N_Vector */
  if (SUNMatGetID(A) != SUNMATRIX_DENSE)
    return(NULL);
  if (SUNDenseMatrix_Rows(A) != SUNDenseMatrix_Columns(A))
    return(NULL);
  MatrixRows = SUNDenseMatrix_Rows(A);
  if ( (N_VGetVectorID(y) != SUNDIALS_NVEC_SERIAL) &&
       (N_VGetVectorID(y) != SUNDIALS_NVEC_OPENMP) &&
       (N_VGetVectorID(y) != SUNDIALS_NVEC_PTHREADS) )
    return(NULL);

  /* optimally this function would be replaced with a generic N_Vector routine */
  VecLength = GlobalVectorLength_DenseLS(y);
  if (MatrixRows != VecLength)
    return(NULL);
  
  /* Create linear solver */
  S = NULL;
  S = (SUNLinearSolver) malloc(sizeof *S);
  if (S == NULL) return(NULL);
  
  /* Create linear solver operation structure */
  ops = NULL;
  ops = (SUNLinearSolver_Ops) malloc(sizeof(struct _generic_SUNLinearSolver_Ops));
  if (ops == NULL) { free(S); return(NULL); }

  /* Attach operations */
  ops->gettype           = SUNLinSolGetType_Dense;
  ops->initialize        = SUNLinSolInitialize_Dense;
  ops->setup             = SUNLinSolSetup_Dense;
  ops->solve             = SUNLinSolSolve_Dense;
  ops->lastflag          = SUNLinSolLastFlag_Dense;
  ops->space             = SUNLinSolSpace_Dense;
  ops->free              = SUNLinSolFree_Dense;
  ops->setatimes         = NULL;
  ops->setpreconditioner = NULL;
  ops->setscalingvectors = NULL;
  ops->numiters          = NULL;
  ops->resnorm           = NULL;
  ops->resid             = NULL;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_Dense) malloc(sizeof(struct _SUNLinearSolverContent_Dense));
  if (content == NULL) { free(ops); free(S); return(NULL); }

  /* Fill content */
  content->N = MatrixRows;
  content->last_flag = 0;
  content->pivots = NULL;
  content->pivots = (sunindextype *) malloc(MatrixRows * sizeof(sunindextype));
  if (content->pivots == NULL) {
    free(content); free(ops); free(S); return(NULL);
  }
  
  /* Attach content and ops */
  S->content = content;
  S->ops     = ops;

  return(S);
}